

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdefaultrt.h
# Opt level: O0

int __thiscall
soplex::SPxDefaultRT<double>::clone
          (SPxDefaultRT<double> *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SPxDefaultRT<double> *this_00;
  
  this_00 = (SPxDefaultRT<double> *)operator_new(0x38);
  SPxDefaultRT(this_00,this);
  return (int)this_00;
}

Assistant:

inline virtual SPxRatioTester<R>* clone() const
   {
      return new SPxDefaultRT(*this);
   }